

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS::Read<tcu::Vector<int,4>>
          (BasicAllTargetsLoadNonMS *this,GLenum internalformat,Vector<int,_4> *value,
          Vector<int,_4> *expected_value)

{
  Vector<int,_4> *__value;
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLint GVar5;
  GLenum GVar6;
  char *src_fs;
  reference pvVar7;
  bool bVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var9;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_140;
  GLchar local_118 [8];
  GLchar name [32];
  GLuint index;
  GLint uniforms;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  bool local_aa;
  allocator<tcu::Vector<int,_4>_> local_a9;
  undefined1 local_a8 [6];
  bool status;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  int kSize;
  GLuint buffer;
  GLuint textures [7];
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<int,_4> *expected_value_local;
  Vector<int,_4> *value_local;
  BasicAllTargetsLoadNonMS *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsLoadNonMS *this_local;
  
  pcStack_30 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_10 = this;
  GenFS<tcu::Vector<int,4>>(&local_58,this,internalformat,expected_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar2;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),7,(GLuint *)&kSize);
  glu::CallLogWrapper::glGenBuffers
            ((CallLogWrapper *)(this + 8),1,
             (GLuint *)
             ((long)&data.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  __value = expected_value_local;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_a9);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8,0x200,
             __value,&local_a9);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_a9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde0,kSize);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde0,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glTexImage1D
            ((CallLogWrapper *)(this + 8),0xde0,0,GVar6,0x10,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde0,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,buffer);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0xde1,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,textures[0]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)(this + 8),0x806f,0,GVar6,0x10,0x10,2,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x84f5,textures[1]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x84f5,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x84f5,0,GVar6,0x10,0x10,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x84f5,0);
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)(this + 8),0x8c2a,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x8c2a,0x100,pvVar7,0x88e8);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)(this + 8),0x8c2a,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c2a,textures[2]);
  glu::CallLogWrapper::glTexBuffer
            ((CallLogWrapper *)(this + 8),0x8c2a,value_local._4_4_,
             data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c2a,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c18,textures[3]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c18,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8c18,0,GVar6,0x10,2,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c18,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,textures[4]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2800,0x2600);
  GVar6 = value_local._4_4_;
  GVar3 = ShaderImageLoadStoreBase::Format<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  GVar4 = ShaderImageLoadStoreBase::Type<tcu::Vector<int,4>>((ShaderImageLoadStoreBase *)this);
  pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                     ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8
                      ,0);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)(this + 8),0x8c1a,0,GVar6,0x10,0x10,2,0,GVar3,GVar4,pvVar7);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,kSize,0,'\0',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,buffer,0,'\0',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,textures[0],0,'\x01',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,textures[1],0,'\0',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),4,textures[2],0,'\0',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),5,textures[3],0,'\x01',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),6,textures[4],0,'\x01',0,35000,value_local._4_4_);
  glu::CallLogWrapper::glClear((CallLogWrapper *)(this + 8),0x4000);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_1d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,0);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_3d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,2);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,3);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,5);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,6);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),0.0,1.0,
             0.0,1.0);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                    ((ShaderImageLoadStoreBase *)this,0,0,0x10,0x10,
                     (vec4 *)((long)&name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count
                             + 4));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&index);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)(this + 8),local_34,0x8b86,(GLint *)(name + 0x1c));
  bVar8 = name._28_4_ != 7;
  if (bVar8) {
    gl4cts::anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n",(ulong)(uint)name._28_4_);
  }
  local_aa = !bVar8 && ((bVar1 ^ 0xffU) & 1) == 0;
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  for (; GVar2 = local_34, (uint)name._24_4_ < (uint)name._28_4_; name._24_4_ = name._24_4_ + 1) {
    glu::CallLogWrapper::glGetActiveUniformName
              ((CallLogWrapper *)(this + 8),local_34,name._24_4_,0x20,(GLsizei *)0x0,local_118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,local_118,&local_161);
    std::make_pair<std::__cxx11::string,unsigned_int&>(&local_140,&local_160,(uint *)(name + 0x18));
    _Var9 = std::
            map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::insert<std::pair<std::__cxx11::string,unsigned_int>>
                      ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&index,&local_140);
    local_178 = (_Base_ptr)_Var9.first._M_node;
    local_170 = _Var9.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"g_image_1d",&local_199);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0xde0);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_198,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"g_image_2d",&local_1c1);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0xde1);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_1c0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"g_image_3d",&local_1e9);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x806f);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_1e8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"g_image_2drect",&local_211);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x84f5);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_210,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"g_image_buffer",&local_239);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x8c2a);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_238,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"g_image_1darray",&local_261);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x8c18);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_260,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  GVar2 = local_34;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"g_image_2darray",&local_289);
  GVar6 = ShaderImageLoadStoreBase::ImageType<tcu::Vector<int,4>>
                    ((ShaderImageLoadStoreBase *)this,0x8c1a);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckUniform
                    ((ShaderImageLoadStoreBase *)this,GVar2,&local_288,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&index,1,GVar6);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_aa = false;
  }
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),7,(GLuint *)&kSize);
  glu::CallLogWrapper::glDeleteBuffers
            ((CallLogWrapper *)(this + 8),1,
             (GLuint *)
             ((long)&data.
                     super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&index);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_a8);
  return local_aa;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, expected_value).c_str());
		GLuint		 textures[7];
		GLuint		 buffer;
		glGenTextures(7, textures);
		glGenBuffers(1, &buffer);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 2, value);

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, internalformat, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);

		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glBufferData(GL_TEXTURE_BUFFER, kSize * sizeof(T), &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, textures[4]);
		glTexBuffer(GL_TEXTURE_BUFFER, internalformat, buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[5]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, internalformat, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[6]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glClear(GL_COLOR_BUFFER_BIT);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image_buffer"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image_2darray"), 6);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
		}

		std::map<std::string, GLuint> name_index_map;
		GLint uniforms;
		glGetProgramiv(program, GL_ACTIVE_UNIFORMS, &uniforms);
		if (uniforms != 7)
		{
			status = false;
			Output("ACTIVE_UNIFORMS is %d should be 7.\n", uniforms);
		}
		for (GLuint index = 0; index < static_cast<GLuint>(uniforms); ++index)
		{
			GLchar name[32];
			glGetActiveUniformName(program, index, sizeof(name), NULL, name);
			name_index_map.insert(std::make_pair(std::string(name), index));
		}

		if (!CheckUniform(program, "g_image_1d", name_index_map, 1, ImageType<T>(GL_TEXTURE_1D)))
			status = false;
		if (!CheckUniform(program, "g_image_2d", name_index_map, 1, ImageType<T>(GL_TEXTURE_2D)))
			status = false;
		if (!CheckUniform(program, "g_image_3d", name_index_map, 1, ImageType<T>(GL_TEXTURE_3D)))
			status = false;
		if (!CheckUniform(program, "g_image_2drect", name_index_map, 1, ImageType<T>(GL_TEXTURE_RECTANGLE)))
			status = false;
		if (!CheckUniform(program, "g_image_buffer", name_index_map, 1, ImageType<T>(GL_TEXTURE_BUFFER)))
			status = false;
		if (!CheckUniform(program, "g_image_1darray", name_index_map, 1, ImageType<T>(GL_TEXTURE_1D_ARRAY)))
			status = false;
		if (!CheckUniform(program, "g_image_2darray", name_index_map, 1, ImageType<T>(GL_TEXTURE_2D_ARRAY)))
			status = false;

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(7, textures);
		glDeleteBuffers(1, &buffer);

		return status;
	}